

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdFreePsbtByteDataList(void *handle,void *data_list_handle)

{
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *this;
  allocator local_41;
  string local_40;
  
  cfd::Initialize();
  if (data_list_handle != (void *)0x0) {
    std::__cxx11::string::string((string *)&local_40,"PsbtDataList",&local_41);
    cfd::capi::CheckBuffer(data_list_handle,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this = *(vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> **)
            ((long)data_list_handle + 0x10);
    if (this != (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)0x0) {
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(this);
      operator_delete(this);
      *(undefined8 *)((long)data_list_handle + 0x10) = 0;
    }
    std::__cxx11::string::string((string *)&local_40,"PsbtDataList",&local_41);
    cfd::capi::FreeBuffer(data_list_handle,&local_40,0x18);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return 0;
}

Assistant:

int CfdFreePsbtByteDataList(void* handle, void* data_list_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (data_list_handle != nullptr) {
      CheckBuffer(data_list_handle, kPrefixPsbtByteDataList);
      CfdCapiPsbtByteDataListHandle* list_handle =
          static_cast<CfdCapiPsbtByteDataListHandle*>(data_list_handle);
      if (list_handle->data_list != nullptr) {
        delete list_handle->data_list;
        list_handle->data_list = nullptr;
      }
      FreeBuffer(
          data_list_handle, kPrefixPsbtByteDataList,
          sizeof(CfdCapiPsbtByteDataListHandle));
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}